

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  int depth;
  stbi__uint32 x;
  stbi__uint32 y;
  stbi__context *s;
  stbi__context *psVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  stbi_uc sVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  stbi_uc **ppsVar13;
  char *pcVar14;
  stbi_uc *psVar15;
  size_t sVar16;
  byte *pbVar17;
  stbi_uc *psVar18;
  bool bVar19;
  ulong uVar20;
  stbi_uc *psVar21;
  ulong uVar22;
  byte bVar23;
  uint uVar24;
  stbi__uint32 raw_len_00;
  uint color;
  long lVar25;
  uint uVar26;
  size_t __size;
  long lVar27;
  int iVar28;
  long lVar29;
  long in_FS_OFFSET;
  int local_514;
  stbi_uc tc [3];
  ulong local_4d0;
  stbi__uint32 raw_len;
  ulong local_4a8;
  stbi_uc *local_4a0;
  stbi_uc *local_498;
  stbi_uc *local_490;
  ulong local_488;
  stbi_uc *local_480;
  stbi__context *local_478;
  size_t local_470;
  int local_468;
  int local_464;
  ulong local_460;
  long local_458;
  stbi__uint16 tc16 [3];
  stbi_uc palette [1024];
  
  tc[2] = '\0';
  tc[0] = '\0';
  tc[1] = '\0';
  s = z->s;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  iVar8 = stbi__check_png_header(s);
  if (iVar8 == 0) {
    local_514 = 0;
  }
  else {
    local_514 = 1;
    if (scan != 1) {
      ppsVar13 = &z->idata;
      bVar3 = true;
      local_460 = 0;
      color = 0;
      bVar4 = false;
      local_4d0 = 0;
      __size = 0;
      local_4a8 = 0;
      bVar5 = false;
      bVar23 = 0;
      do {
        iVar8 = stbi__get16be(s);
        uVar9 = stbi__get16be(s);
        uVar12 = iVar8 * 0x10000 + uVar9;
        uVar10 = stbi__get16be(s);
        uVar11 = stbi__get16be(s);
        uVar24 = uVar10 << 0x10 | uVar11;
        uVar26 = (uint)local_4d0;
        if ((int)uVar24 < 0x49484452) {
          if (uVar24 == 0x43674249) {
            bVar4 = true;
LAB_0010f0c0:
            stbi__skip(s,uVar12);
LAB_0010f372:
            stbi__get16be(s);
            stbi__get16be(s);
            bVar2 = true;
          }
          else {
            iVar8 = (int)local_4a8;
            if (uVar24 == 0x49444154) {
              if (bVar3) {
LAB_0010f19b:
                *(char **)(in_FS_OFFSET + -0x10) = "first not IHDR";
                bVar3 = true;
                goto LAB_0010f1b5;
              }
              if ((bVar23 != 0) && (uVar26 == 0)) {
                *(char **)(in_FS_OFFSET + -0x10) = "no PLTE";
                bVar3 = false;
                local_4d0 = 0;
                goto LAB_0010f1b5;
              }
              if (scan == 2) {
                s->img_n = (uint)bVar23;
                local_514 = 1;
                bVar3 = false;
                goto LAB_0010fde2;
              }
              uVar9 = uVar12 + iVar8;
              if (iVar8 <= (int)uVar9) {
                if ((uint)__size < uVar9) {
                  sVar16 = 0x1000;
                  if (0x1000 < uVar12) {
                    sVar16 = (ulong)uVar12;
                  }
                  if ((uint)__size != 0) {
                    sVar16 = __size;
                  }
                  do {
                    __size = sVar16;
                    sVar16 = (ulong)((uint)__size * 2);
                  } while ((uint)__size < uVar9);
                  psVar15 = (stbi_uc *)realloc(*ppsVar13,__size);
                  if (psVar15 == (stbi_uc *)0x0) {
                    *(char **)(in_FS_OFFSET + -0x10) = "outofmem";
                    goto LAB_0010fcc5;
                  }
                  *ppsVar13 = psVar15;
                }
                iVar8 = stbi__getn(s,*ppsVar13 + (local_4a8 & 0xffffffff),uVar12);
                bVar3 = false;
                if (iVar8 != 0) {
                  local_4a8 = (ulong)uVar9;
                  goto LAB_0010f372;
                }
                *(char **)(in_FS_OFFSET + -0x10) = "outofdata";
              }
LAB_0010fcc5:
              bVar3 = false;
              local_514 = 0;
              bVar2 = false;
            }
            else {
              if (uVar24 != 0x49454e44) {
LAB_0010f0fa:
                if (bVar3) goto LAB_0010f19b;
                bVar3 = false;
                if ((uVar10 >> 0xd & 1) == 0) {
                  stbi__parse_png_file::invalid_chunk[0] = (char)(uVar24 >> 0x18);
                  stbi__parse_png_file::invalid_chunk[1] = (char)(uVar24 >> 0x10);
                  stbi__parse_png_file::invalid_chunk[2] = (char)(uVar11 >> 8);
                  stbi__parse_png_file::invalid_chunk[3] = (char)uVar11;
                  pcVar14 = stbi__parse_png_file::invalid_chunk;
                  goto LAB_0010f390;
                }
                goto LAB_0010f0c0;
              }
              if (bVar3) {
                pcVar14 = "first not IHDR";
LAB_0010f001:
                *(char **)(in_FS_OFFSET + -0x10) = pcVar14;
                local_514 = 0;
              }
              else if (scan == 0) {
                if (*ppsVar13 == (stbi_uc *)0x0) {
                  pcVar14 = "no IDAT";
                  goto LAB_0010f001;
                }
                raw_len = s->img_n * s->img_y * (z->depth * s->img_x + 7 >> 3) + s->img_y;
                psVar15 = (stbi_uc *)
                          stbi_zlib_decode_malloc_guesssize_headerflag
                                    ((char *)*ppsVar13,iVar8,raw_len,(int *)&raw_len,(uint)!bVar4);
                z->expanded = psVar15;
                local_514 = 0;
                if (psVar15 != (stbi_uc *)0x0) {
                  free(*ppsVar13);
                  raw_len_00 = raw_len;
                  *ppsVar13 = (stbi_uc *)0x0;
                  iVar8 = s->img_n + 1;
                  if (bVar5 || (bVar23 == 0 && req_comp != 3) && iVar8 == req_comp) {
                    s->img_out_n = iVar8;
                  }
                  else {
                    s->img_out_n = s->img_n;
                  }
                  iVar8 = s->img_out_n;
                  depth = z->depth;
                  iVar28 = iVar8 << (depth == 0x10);
                  x = z->s->img_x;
                  y = z->s->img_y;
                  if ((int)local_460 == 0) {
                    iVar8 = stbi__create_png_image_raw(z,z->expanded,raw_len,iVar8,x,y,depth,color);
                    if (iVar8 == 0) goto LAB_0010fde2;
                  }
                  else {
                    local_498 = z->expanded;
                    local_4a0 = (stbi_uc *)stbi__malloc_mad3(x,y,iVar28,0);
                    local_470 = (size_t)iVar28;
                    lVar29 = 0;
                    psVar15 = local_498;
                    local_468 = iVar8;
                    do {
                      psVar1 = z->s;
                      local_490 = (stbi_uc *)(long)(int)(&DAT_00116c60)[lVar29];
                      uVar12 = (&DAT_00116ca0)[lVar29];
                      uVar24 = ~(&DAT_00116c60)[lVar29] + psVar1->img_x + uVar12;
                      uVar10 = uVar24 / uVar12;
                      uVar9 = (&DAT_00116cc0)[lVar29];
                      uVar26 = ~(&DAT_00116c80)[lVar29] + psVar1->img_y + uVar9;
                      uVar11 = uVar26 / uVar9;
                      bVar2 = true;
                      if ((uVar12 <= uVar24) && (uVar9 <= uVar26)) {
                        local_478 = (stbi__context *)
                                    CONCAT44(local_478._4_4_,(&DAT_00116c80)[lVar29]);
                        local_464 = uVar10 * depth * psVar1->img_n;
                        local_480 = (stbi_uc *)(long)(int)uVar12;
                        local_458 = lVar29;
                        iVar28 = stbi__create_png_image_raw
                                           (z,psVar15,raw_len_00,iVar8,uVar10,uVar11,depth,color);
                        if (iVar28 == 0) {
                          free(local_4a0);
                          bVar2 = false;
                          lVar29 = local_458;
                        }
                        else {
                          local_498 = psVar15;
                          if (0 < (int)uVar11) {
                            iVar8 = (int)local_470;
                            iVar28 = (int)local_478 * iVar8;
                            local_490 = local_4a0 + (long)local_490 * local_470;
                            lVar29 = (long)local_480 * local_470;
                            local_488 = 0;
                            sVar16 = local_470;
                            do {
                              if (0 < (int)uVar10) {
                                local_478 = z->s;
                                local_480 = z->out;
                                lVar27 = local_488 * (long)(int)uVar10;
                                lVar25 = 0;
                                psVar15 = local_490;
                                do {
                                  memcpy(psVar15 + local_478->img_x * iVar28,
                                         local_480 + (lVar27 + lVar25) * sVar16,local_470);
                                  lVar25 = lVar25 + 1;
                                  psVar15 = psVar15 + lVar29;
                                  sVar16 = local_470;
                                } while (lVar25 < (int)uVar10);
                              }
                              local_488 = local_488 + 1;
                              iVar28 = iVar28 + uVar9 * iVar8;
                            } while (local_488 < uVar11);
                          }
                          uVar11 = ((local_464 + 7 >> 3) + 1) * uVar11;
                          free(z->out);
                          psVar15 = local_498 + uVar11;
                          raw_len_00 = raw_len_00 - uVar11;
                          bVar2 = true;
                          lVar29 = local_458;
                          iVar8 = local_468;
                        }
                      }
                      if (!bVar2) goto LAB_0010fde2;
                      lVar29 = lVar29 + 1;
                    } while (lVar29 != 7);
                    z->out = local_4a0;
                  }
                  if (bVar5) {
                    if (z->depth == 0x10) {
                      stbi__compute_transparency16(z,tc16,s->img_out_n);
                    }
                    else {
                      stbi__compute_transparency(z,tc,s->img_out_n);
                    }
                  }
                  if (((bVar4) && (stbi__de_iphone_flag != 0)) && (2 < s->img_out_n)) {
                    stbi__de_iphone(z);
                  }
                  if (bVar23 == 0) {
                    if (bVar5) {
                      s->img_n = s->img_n + 1;
                    }
                  }
                  else {
                    s->img_n = (uint)bVar23;
                    uVar12 = (uint)bVar23;
                    if (2 < req_comp) {
                      uVar12 = req_comp;
                    }
                    s->img_out_n = uVar12;
                    psVar15 = z->out;
                    uVar9 = z->s->img_y * z->s->img_x;
                    psVar18 = (stbi_uc *)stbi__malloc_mad2(uVar9,uVar12,0);
                    if (psVar18 == (stbi_uc *)0x0) {
                      *(char **)(in_FS_OFFSET + -0x10) = "outofmem";
                    }
                    else {
                      if (uVar12 == 3) {
                        if (uVar9 != 0) {
                          uVar20 = 0;
                          psVar21 = psVar18;
                          do {
                            uVar22 = (ulong)psVar15[uVar20];
                            *psVar21 = palette[uVar22 * 4];
                            psVar21[1] = palette[uVar22 * 4 + 1];
                            psVar21[2] = palette[uVar22 * 4 + 2];
                            psVar21 = psVar21 + 3;
                            uVar20 = uVar20 + 1;
                          } while (uVar9 != uVar20);
                        }
                      }
                      else if (uVar9 != 0) {
                        uVar20 = 0;
                        do {
                          uVar22 = (ulong)psVar15[uVar20];
                          psVar18[uVar20 * 4] = palette[uVar22 * 4];
                          psVar18[uVar20 * 4 + 1] = palette[uVar22 * 4 + 1];
                          psVar18[uVar20 * 4 + 2] = palette[uVar22 * 4 + 2];
                          psVar18[uVar20 * 4 + 3] = palette[uVar22 * 4 + 3];
                          uVar20 = uVar20 + 1;
                        } while (uVar9 != uVar20);
                      }
                      free(psVar15);
                      z->out = psVar18;
                    }
                    if (psVar18 == (stbi_uc *)0x0) goto LAB_0010fde2;
                  }
                  free(z->expanded);
                  z->expanded = (stbi_uc *)0x0;
                  stbi__get16be(s);
                  stbi__get16be(s);
                  goto LAB_0010f20d;
                }
              }
              else {
LAB_0010f20d:
                local_514 = 1;
              }
LAB_0010fde2:
              bVar2 = false;
            }
          }
        }
        else if (uVar24 == 0x74524e53) {
          if (bVar3) {
            *(char **)(in_FS_OFFSET + -0x10) = "first not IHDR";
            bVar3 = true;
LAB_0010f1eb:
            local_514 = 0;
          }
          else {
            if (*ppsVar13 != (stbi_uc *)0x0) {
              pcVar14 = "tRNS after IDAT";
LAB_0010f1d8:
              *(char **)(in_FS_OFFSET + -0x10) = pcVar14;
              bVar3 = false;
              goto LAB_0010f1eb;
            }
            if (bVar23 == 0) {
              if ((s->img_n & 1U) == 0) {
                pcVar14 = "tRNS with alpha";
              }
              else {
                if (s->img_n * 2 == uVar12) {
                  bVar5 = true;
                  if (z->depth == 0x10) {
                    if (0 < s->img_n) {
                      lVar29 = 0;
                      do {
                        iVar8 = stbi__get16be(s);
                        tc16[lVar29] = (stbi__uint16)iVar8;
                        lVar29 = lVar29 + 1;
                      } while (lVar29 < s->img_n);
                    }
                  }
                  else if (0 < s->img_n) {
                    lVar29 = 0;
                    do {
                      iVar8 = stbi__get16be(s);
                      tc[lVar29] = ""[z->depth] * (char)iVar8;
                      lVar29 = lVar29 + 1;
                    } while (lVar29 < s->img_n);
                  }
                  bVar3 = false;
                  bVar23 = 0;
                  goto LAB_0010f372;
                }
                pcVar14 = "bad tRNS len";
              }
              *(char **)(in_FS_OFFSET + -0x10) = pcVar14;
              bVar3 = false;
              bVar23 = 0;
              goto LAB_0010f1b5;
            }
            if (scan != 2) {
              if (uVar26 == 0) {
                *(char **)(in_FS_OFFSET + -0x10) = "tRNS before PLTE";
                bVar3 = false;
                local_4d0 = 0;
                goto LAB_0010f1eb;
              }
              if (uVar12 <= uVar26) {
                bVar3 = false;
                bVar23 = 4;
                if (uVar12 != 0) {
                  uVar20 = 0;
                  do {
                    psVar15 = s->img_buffer;
                    if (psVar15 < s->img_buffer_end) {
LAB_0010fb16:
                      s->img_buffer = psVar15 + 1;
                      sVar6 = *psVar15;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        psVar15 = s->img_buffer;
                        goto LAB_0010fb16;
                      }
                      sVar6 = '\0';
                    }
                    palette[uVar20 * 4 + 3] = sVar6;
                    uVar20 = uVar20 + 1;
                    bVar23 = 4;
                  } while (uVar9 + iVar8 * 0x10000 != uVar20);
                }
                goto LAB_0010f372;
              }
              pcVar14 = "bad tRNS len";
              goto LAB_0010f1d8;
            }
            s->img_n = 4;
            local_514 = 1;
            bVar3 = false;
          }
          bVar2 = false;
        }
        else {
          if (uVar24 == 0x504c5445) {
            if (bVar3) goto LAB_0010f19b;
            if ((uVar12 < 0x301) &&
               (local_4d0 = (ulong)uVar9 * 0x55555556 >> 0x20,
               (int)((ulong)uVar9 * 0x55555556 >> 0x20) * 3 == uVar12)) {
              bVar3 = false;
              if (2 < uVar9) {
                uVar20 = 0;
                do {
                  psVar15 = s->img_buffer;
                  if (psVar15 < s->img_buffer_end) {
LAB_0010f294:
                    s->img_buffer = psVar15 + 1;
                    sVar6 = *psVar15;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      psVar15 = s->img_buffer;
                      goto LAB_0010f294;
                    }
                    sVar6 = '\0';
                  }
                  palette[uVar20 * 4] = sVar6;
                  psVar15 = s->img_buffer;
                  if (psVar15 < s->img_buffer_end) {
LAB_0010f2ce:
                    s->img_buffer = psVar15 + 1;
                    sVar6 = *psVar15;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      psVar15 = s->img_buffer;
                      goto LAB_0010f2ce;
                    }
                    sVar6 = '\0';
                  }
                  palette[uVar20 * 4 + 1] = sVar6;
                  psVar15 = s->img_buffer;
                  if (psVar15 < s->img_buffer_end) {
LAB_0010f308:
                    s->img_buffer = psVar15 + 1;
                    sVar6 = *psVar15;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      psVar15 = s->img_buffer;
                      goto LAB_0010f308;
                    }
                    sVar6 = '\0';
                  }
                  palette[uVar20 * 4 + 2] = sVar6;
                  palette[uVar20 * 4 + 3] = 0xff;
                  uVar20 = uVar20 + 1;
                } while (local_4d0 != uVar20);
              }
              goto LAB_0010f372;
            }
            pcVar14 = "invalid PLTE";
LAB_0010f390:
            *(char **)(in_FS_OFFSET + -0x10) = pcVar14;
            bVar3 = false;
LAB_0010f1b5:
            bVar2 = false;
            local_514 = 0;
            goto LAB_0010fde4;
          }
          if (uVar24 != 0x49484452) goto LAB_0010f0fa;
          if (bVar3) {
            if (uVar12 != 0xd) {
              pcVar14 = "bad IHDR len";
              goto LAB_0010f34a;
            }
            iVar8 = stbi__get16be(s);
            uVar12 = stbi__get16be(s);
            s->img_x = uVar12 | iVar8 << 0x10;
            iVar8 = stbi__get16be(s);
            uVar12 = stbi__get16be(s);
            uVar12 = uVar12 | iVar8 << 0x10;
            s->img_y = uVar12;
            if ((0x1000000 < uVar12) || (0x1000000 < s->img_x)) {
              pcVar14 = "too large";
              goto LAB_0010f34a;
            }
            pbVar17 = s->img_buffer;
            if (pbVar17 < s->img_buffer_end) {
LAB_0010f554:
              s->img_buffer = pbVar17 + 1;
              bVar7 = *pbVar17;
            }
            else {
              if (s->read_from_callbacks != 0) {
                stbi__refill_buffer(s);
                pbVar17 = s->img_buffer;
                goto LAB_0010f554;
              }
              bVar7 = 0;
            }
            z->depth = (uint)bVar7;
            if ((0x10 < bVar7) || ((0x10116U >> (bVar7 & 0x1f) & 1) == 0)) {
              pcVar14 = "1/2/4/8/16-bit only";
              goto LAB_0010f34a;
            }
            pbVar17 = s->img_buffer;
            if (pbVar17 < s->img_buffer_end) {
LAB_0010f5ab:
              s->img_buffer = pbVar17 + 1;
              color = (uint)*pbVar17;
            }
            else {
              if (s->read_from_callbacks != 0) {
                stbi__refill_buffer(s);
                pbVar17 = s->img_buffer;
                goto LAB_0010f5ab;
              }
              color = 0;
            }
            if ((byte)color < 7) {
              if (color != 3) {
                bVar7 = bVar23;
                if ((color & 1) == 0) goto LAB_0010fa75;
                goto LAB_0010f5c6;
              }
              bVar7 = 3;
              if (z->depth == 0x10) {
                *(char **)(in_FS_OFFSET + -0x10) = "bad ctype";
                color = 3;
                goto LAB_0010f5d8;
              }
LAB_0010fa75:
              bVar23 = bVar7;
              psVar15 = s->img_buffer;
              if (psVar15 < s->img_buffer_end) {
LAB_0010faa4:
                s->img_buffer = psVar15 + 1;
                if (*psVar15 == '\0') goto LAB_0010fcdb;
                pcVar14 = "bad comp method";
LAB_0010fe77:
                *(char **)(in_FS_OFFSET + -0x10) = pcVar14;
                bVar19 = false;
                local_514 = 0;
                goto LAB_0010f35d;
              }
              if (s->read_from_callbacks != 0) {
                stbi__refill_buffer(s);
                psVar15 = s->img_buffer;
                goto LAB_0010faa4;
              }
LAB_0010fcdb:
              sVar6 = stbi__get8(s);
              if (sVar6 != '\0') {
                pcVar14 = "bad filter method";
                goto LAB_0010fe77;
              }
              bVar7 = stbi__get8(s);
              local_460 = (ulong)bVar7;
              if (1 < bVar7) {
                pcVar14 = "bad interlace method";
                goto LAB_0010fe77;
              }
              uVar12 = s->img_x;
              if ((uVar12 == 0) || (uVar9 = s->img_y, uVar9 == 0)) {
                pcVar14 = "0-pixel image";
                goto LAB_0010fe77;
              }
              if (bVar23 == 0) {
                uVar10 = (3 < (byte)color) + 1 + (color & 2);
                s->img_n = uVar10;
                if ((uint)((0x40000000 / (ulong)uVar12) / (ulong)uVar10) < uVar9) {
                  *(char **)(in_FS_OFFSET + -0x10) = "too large";
                  bVar23 = 0;
                  goto LAB_0010f355;
                }
                if (scan != 2) goto LAB_0010ff03;
                local_514 = 1;
                bVar19 = false;
                bVar23 = 0;
                goto LAB_0010f35d;
              }
              s->img_n = 1;
              if (uVar9 <= (uint)(0x40000000 / (ulong)uVar12 >> 2)) {
LAB_0010ff03:
                bVar19 = true;
                goto LAB_0010f35d;
              }
              *(char **)(in_FS_OFFSET + -0x10) = "too large";
              goto LAB_0010f355;
            }
LAB_0010f5c6:
            *(char **)(in_FS_OFFSET + -0x10) = "bad ctype";
LAB_0010f5d8:
            bVar19 = false;
            local_514 = 0;
          }
          else {
            pcVar14 = "multiple IHDR";
LAB_0010f34a:
            *(char **)(in_FS_OFFSET + -0x10) = pcVar14;
LAB_0010f355:
            bVar19 = false;
            local_514 = 0;
          }
LAB_0010f35d:
          bVar3 = false;
          bVar2 = false;
          if (bVar19) goto LAB_0010f372;
        }
LAB_0010fde4:
      } while (bVar2);
    }
  }
  return local_514;
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3]={0};
   stbi__uint16 tc16[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s);
            s->img_y = stbi__get32be(s);
            if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            z->depth = stbi__get8(s);  if (z->depth != 1 && z->depth != 2 && z->depth != 4 && z->depth != 8 && z->depth != 16)  return stbi__err("1/2/4/8/16-bit only","PNG not supported: 1/2/4/8/16-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3 && z->depth == 16)                  return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
               if (scan == STBI__SCAN_header) return 1;
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
               // if SCAN_header, have to scan to see if we have a tRNS
            }
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               if (z->depth == 16) {
                  for (k = 0; k < s->img_n; ++k) tc16[k] = (stbi__uint16)stbi__get16be(s); // copy the values as-is
               } else {
                  for (k = 0; k < s->img_n; ++k) tc[k] = (stbi_uc)(stbi__get16be(s) & 255) * stbi__depth_scale_table[z->depth]; // non 8-bit images will be larger
               }
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) { s->img_n = pal_img_n; return 1; }
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi__uint32 idata_limit_old = idata_limit;
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               STBI_NOTUSED(idata_limit_old);
               p = (stbi_uc *) STBI_REALLOC_SIZED(z->idata, idata_limit_old, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * z->depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, z->depth, color, interlace)) return 0;
            if (has_trans) {
               if (z->depth == 16) {
                  if (!stbi__compute_transparency16(z, tc16, s->img_out_n)) return 0;
               } else {
                  if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
               }
            }
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            } else if (has_trans) {
               // non-paletted image with tRNS -> source image has (constant) alpha
               ++s->img_n;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            // end of PNG chunk, read and skip CRC
            stbi__get32be(s);
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}